

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeProduct::~IfcTypeProduct(IfcTypeProduct *this)

{
  IfcTypeObject *this_00;
  long *plVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)&this->super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeObject *)(&(this->super_IfcTypeObject).field_0x0 + lVar2);
  plVar1 = (long *)((this->Tag).ptr.field_2._M_local_buf + lVar2);
  plVar1[-0x26] = 0x816f58;
  plVar1[3] = 0x816ff8;
  plVar1[-0x15] = 0x816f80;
  plVar1[-0x13] = 0x816fa8;
  plVar1[-8] = 0x816fd0;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  pvVar3 = *(void **)&this_00->field_0x100;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this_00[1].field_0x8 - (long)pvVar3);
  }
  IfcTypeObject::~IfcTypeObject(this_00,&PTR_construction_vtable_24__00817010);
  operator_delete(this_00,0x160);
  return;
}

Assistant:

IfcTypeProduct() : Object("IfcTypeProduct") {}